

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  code *pcVar4;
  slot_type *psVar5;
  slot_type *psVar6;
  FileOptions_OptimizeMode FVar7;
  reference ppVar8;
  EnumValueDescriptor *pEVar9;
  EnumValueDescriptor *pEVar10;
  EnumValueDescriptor *pEVar11;
  string *psVar12;
  string *extraout_RAX;
  string *psVar13;
  bool bVar14;
  slot_type *psVar15;
  Options *extraout_RDX;
  ulong uVar16;
  int iVar17;
  int index;
  long lVar18;
  long *plVar19;
  ValueLimits VVar20;
  LogMessageFatal aLStack_80 [16];
  slot_type *psStack_70;
  long alStack_40 [2];
  
  psVar1 = (slot_type *)a->ctrl_;
  if ((psVar1 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ ||
       psVar1 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar1)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 != (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ &&
         psVar2 != (slot_type *)0x0) && ((char)*(code *)psVar2 < '\0')) goto LAB_00180f80;
    if (psVar1 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ &&
        psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_) {
LAB_00180f73:
      return psVar1 == psVar2;
    }
    if ((psVar1 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_) !=
        (psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_))
    goto LAB_00180f85;
    if (psVar1 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_00180f73;
    if ((psVar2 == (slot_type *)&kSooControl) == (psVar1 == (slot_type *)&kSooControl)) {
      a = (iterator *)(a->field_1).slot_;
      psVar3 = (b->field_1).slot_;
      if (psVar1 == (slot_type *)&kSooControl) {
        bVar14 = (slot_type *)a == psVar3;
      }
      else {
        psVar15 = psVar3;
        psVar5 = psVar2;
        psVar6 = (slot_type *)a;
        if (psVar2 < psVar1) {
          psVar15 = (slot_type *)a;
          psVar5 = psVar1;
          psVar6 = psVar3;
        }
        bVar14 = psVar6 <= psVar15 && psVar5 < psVar6;
      }
      if (bVar14) goto LAB_00180f73;
    }
  }
  else {
    operator==();
LAB_00180f80:
    operator==();
LAB_00180f85:
    operator==();
  }
  operator==();
  pcVar4 = *(code **)a;
  if (pcVar4 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
    ::iterator::operator->((iterator *)a);
  }
  else if (pcVar4 != google::protobuf::internal::TypeCardToString_abi_cxx11_) {
    if (-1 < (char)*pcVar4) {
      ppVar8 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
               ::iterator::operator*(a);
      return SUB81(ppVar8,0);
    }
    goto LAB_00180fbe;
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
  ::iterator::operator->((iterator *)a);
LAB_00180fbe:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
  ::iterator::operator->((iterator *)a);
  lVar18 = (long)*(int *)((long)&(((value_type *)a)->first)._M_dataplus._M_p + 4);
  if (lVar18 < 1) {
    psVar12 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        (0,lVar18,"index < value_count()");
  }
  else {
    psVar12 = (string *)0x0;
  }
  if (psVar12 == (string *)0x0) {
    pEVar10 = *(EnumValueDescriptor **)((long)a + 0x38);
    lVar18 = (long)*(int *)((long)&(((value_type *)a)->first)._M_dataplus._M_p + 4);
    if (lVar18 < 1) {
      psVar12 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          (0,lVar18,"index < value_count()");
    }
    else {
      psVar12 = (string *)0x0;
    }
    if (psVar12 == (string *)0x0) {
      pEVar11 = *(EnumValueDescriptor **)((long)&(((value_type *)a)->second).flag_name.field_2 + 8);
      if (1 < *(int *)((long)&(((value_type *)a)->first)._M_dataplus._M_p + 4)) {
        iVar17 = 1;
        do {
          pEVar9 = google::protobuf::EnumDescriptor::value((EnumDescriptor *)a,iVar17);
          if (*(int *)(pEVar9 + 4) < *(int *)(pEVar10 + 4)) {
            pEVar10 = google::protobuf::EnumDescriptor::value((EnumDescriptor *)a,iVar17);
          }
          pEVar9 = google::protobuf::EnumDescriptor::value((EnumDescriptor *)a,iVar17);
          if (*(int *)(pEVar11 + 4) < *(int *)(pEVar9 + 4)) {
            pEVar11 = google::protobuf::EnumDescriptor::value((EnumDescriptor *)a,iVar17);
          }
          iVar17 = iVar17 + 1;
        } while (iVar17 < *(int *)((long)&(((value_type *)a)->first)._M_dataplus._M_p + 4));
      }
      return SUB81(pEVar10,0);
    }
  }
  else {
    google::protobuf::compiler::cpp::EnumGenerator::ValueLimits::FromEnum();
    psVar12 = extraout_RAX;
  }
  plVar19 = alStack_40;
  google::protobuf::compiler::cpp::EnumGenerator::ValueLimits::FromEnum();
  psStack_70 = (slot_type *)a;
  *plVar19 = (long)psVar12;
  google::protobuf::compiler::cpp::Options::Options((Options *)(plVar19 + 1),extraout_RDX);
  if ((long)*(int *)((EnumDescriptor *)psVar12 + 4) < 1) {
    psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        (0,(long)*(int *)((EnumDescriptor *)psVar12 + 4),"index < value_count()");
  }
  else {
    psVar13 = (string *)0x0;
  }
  if (psVar13 != (string *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_80,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
               ,0xa27,*(undefined8 *)(psVar13 + 8),*(undefined8 *)psVar13);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_80);
  }
  iVar17 = *(int *)(*(long *)((EnumDescriptor *)psVar12 + 0x38) + 4);
  if (0 < *(int *)((EnumDescriptor *)psVar12 + 4)) {
    index = 0;
    do {
      pEVar10 = google::protobuf::EnumDescriptor::value((EnumDescriptor *)psVar12,index);
      if (iVar17 < *(int *)(pEVar10 + 4)) {
        pEVar10 = google::protobuf::EnumDescriptor::value((EnumDescriptor *)psVar12,index);
        iVar17 = *(int *)(pEVar10 + 4);
      }
      index = index + 1;
    } while (index < *(int *)((EnumDescriptor *)psVar12 + 4));
  }
  *(bool *)(plVar19 + 0x1b) = iVar17 != 0x7fffffff;
  FVar7 = google::protobuf::compiler::cpp::GetOptimizeFor
                    (*(FileDescriptor **)(*plVar19 + 0x10),(Options *)(plVar19 + 1),(bool *)0x0);
  *(bool *)((long)plVar19 + 0xda) = FVar7 != FileOptions_OptimizeMode_LITE_RUNTIME;
  VVar20 = google::protobuf::compiler::cpp::EnumGenerator::ValueLimits::FromEnum
                     ((EnumDescriptor *)*plVar19);
  *(ValueLimits *)(plVar19 + 0x1c) = VVar20;
  if (*(char *)((long)plVar19 + 0xda) == '\x01') {
    uVar16 = (long)*(int *)(VVar20.max + 4) - (long)*(int *)(VVar20.min + 4);
    bVar14 = uVar16 < (ulong)((long)*(int *)(*plVar19 + 4) * 2) || uVar16 < 0x10;
  }
  else {
    bVar14 = false;
  }
  *(bool *)((long)plVar19 + 0xd9) = bVar14;
  return bVar14;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }